

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

float dx(qnode_ptr_t p,qnode_ptr_t q,int x,int y,int z)

{
  int iVar1;
  long lVar2;
  kernel_t *pkVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  
  iVar1 = C.m / 2;
  iVar5 = p->ofst + iVar1;
  if ((((iVar5 <= y) && (iVar5 <= x)) && (x < p->sizy - iVar5)) && (y < p->sizx - iVar5)) {
    iVar5 = p->res;
    (*q->param_ptr[z])[iVar5 * x + y].err = 0;
    lVar4 = ((long)x - (long)iVar1) * (long)iVar5 + (long)y;
    fVar6 = 0.0;
    pkVar3 = &C;
    for (lVar2 = (long)-iVar1; lVar2 <= iVar1; lVar2 = lVar2 + 1) {
      fVar6 = fVar6 + (*p->gauss_ptr[z])[lVar4] * pkVar3->k[0];
      lVar4 = lVar4 + iVar5;
      pkVar3 = (kernel_t *)(pkVar3->k + 1);
    }
    return fVar6 / C.f;
  }
  (*q->param_ptr[z])[x * q->res + y].err = 1;
  return 0.0;
}

Assistant:

float dx(p,q,x,y,z)
qnode_ptr_t p, q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,p->sizy,p->sizx,p->ofst,h,1)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[p->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*p->gauss_ptr[z])[p->res*(x+i) + y]*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}